

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O2

unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> __thiscall
Diligent::ShaderCodeBufferDescX::
PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
          (ShaderCodeBufferDescX *this,
          __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
          RangeStart,
          __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
          RangeEnd,IMemoryAllocator *RawAllocator)

{
  uint8_t *puVar1;
  size_t count;
  ShaderCodeBufferDesc *pSVar2;
  char (*Args_1) [26];
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  Refl;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  _Var3;
  ShaderCodeBufferDesc SVar4;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> uVar5;
  string msg;
  FixedLinearAllocator Allocator;
  
  Allocator.m_ReservedSize = 0;
  Allocator.m_CurrAlignment = 0;
  Allocator.m_pDataStart = (uint8_t *)0x0;
  Allocator.m_pCurrPtr = (uint8_t *)0x0;
  Allocator.m_DbgCurrAllocation = 0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Allocator.m_DbgUsingExternalMemory = false;
  Args_1 = (char (*) [26])0x28;
  count = ((long)RangeEnd._M_current - (long)RangeStart._M_current) / 0x28;
  Allocator.m_pAllocator = RawAllocator;
  FixedLinearAllocator::AddSpace<Diligent::ShaderCodeBufferDesc>(&Allocator,count);
  for (_Var3._M_current = RangeStart._M_current; _Var3._M_current != RangeEnd._M_current;
      _Var3._M_current = _Var3._M_current + 1) {
    ShaderCodeVariableDescX::ReserveSpaceForMembers(&Allocator,&(_Var3._M_current)->Variables);
  }
  FixedLinearAllocator::Reserve(&Allocator);
  puVar1 = Allocator.m_pDataStart;
  Allocator.m_pAllocator = (IMemoryAllocator *)0x0;
  *(IMemoryAllocator **)&this->super_ShaderCodeBufferDesc = RawAllocator;
  (this->super_ShaderCodeBufferDesc).pVariables = (ShaderCodeVariableDesc *)Allocator.m_pDataStart;
  pSVar2 = FixedLinearAllocator::ConstructArray<Diligent::ShaderCodeBufferDesc>(&Allocator,count);
  if (pSVar2 != (ShaderCodeBufferDesc *)puVar1) {
    FormatString<char[26],char[26]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pRefl == DataBuffer.get()",Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PackArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/ShaderToolsCommon.hpp"
               ,0x172);
    std::__cxx11::string::~string((string *)&msg);
  }
  for (; RangeStart._M_current != RangeEnd._M_current;
      RangeStart._M_current = RangeStart._M_current + 1) {
    SVar4 = MakeCopy(RangeStart._M_current,&Allocator);
    *pSVar2 = SVar4;
    pSVar2 = pSVar2 + 1;
  }
  FixedLinearAllocator::~FixedLinearAllocator(&Allocator);
  uVar5._M_t.super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  _M_t.super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar5._M_t.super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  _M_t.super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl.
  m_Allocator = (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)
                (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)this
  ;
  return (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>)
         uVar5._M_t.
         super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
         super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>;
}

Assistant:

static std::unique_ptr<void, STDDeleterRawMem<void>> PackArray(IterType RangeStart, IterType RangeEnd, IMemoryAllocator& RawAllocator)
    {
        FixedLinearAllocator Allocator{RawAllocator};

        const auto Size = RangeEnd - RangeStart;
        Allocator.AddSpace<ShaderCodeBufferDesc>(Size);
        for (auto Refl = RangeStart; Refl != RangeEnd; ++Refl)
            Refl->ReserveSpace(Allocator);

        Allocator.Reserve();
        std::unique_ptr<void, STDDeleterRawMem<void>> DataBuffer{Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

        auto* pRefl = Allocator.ConstructArray<ShaderCodeBufferDesc>(Size);
        VERIFY_EXPR(pRefl == DataBuffer.get());
        for (auto Refl = RangeStart; Refl != RangeEnd; ++Refl)
            *(pRefl++) = Refl->MakeCopy(Allocator);

        return DataBuffer;
    }